

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O3

void __thiscall
jsonnet::internal::TraceFrame::TraceFrame(TraceFrame *this,LocationRange *location,string *name)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  
  (this->location).file._M_dataplus._M_p = (pointer)&(this->location).file.field_2;
  pcVar1 = (location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (location->file)._M_string_length);
  uVar6 = (location->begin).line;
  uVar2 = *(undefined4 *)((long)&(location->begin).line + 4);
  uVar7 = (location->begin).column;
  uVar3 = *(undefined4 *)((long)&(location->begin).column + 4);
  uVar4 = *(undefined4 *)((long)&(location->end).line + 4);
  uVar8 = (location->end).column;
  uVar5 = *(undefined4 *)((long)&(location->end).column + 4);
  *(int *)&(this->location).end.line = (int)(location->end).line;
  *(undefined4 *)((long)&(this->location).end.line + 4) = uVar4;
  *(int *)&(this->location).end.column = (int)uVar8;
  *(undefined4 *)((long)&(this->location).end.column + 4) = uVar5;
  *(int *)&(this->location).begin.line = (int)uVar6;
  *(undefined4 *)((long)&(this->location).begin.line + 4) = uVar2;
  *(int *)&(this->location).begin.column = (int)uVar7;
  *(undefined4 *)((long)&(this->location).begin.column + 4) = uVar3;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

TraceFrame(const LocationRange &location, const std::string &name = "")
        : location(location), name(name)
    {
    }